

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTexture.cpp
# Opt level: O0

int __thiscall glu::TextureBuffer::init(TextureBuffer *this,EVP_PKEY_CTX *ctx)

{
  code *pcVar1;
  bool bVar2;
  deUint32 dVar3;
  int extraout_EAX;
  undefined4 extraout_var;
  ContextInfo *pCVar4;
  NotSupportedError *pNVar5;
  void *dst;
  size_t sVar6;
  size_t in_RCX;
  size_t in_RDX;
  size_t in_R8;
  void *in_R9;
  ApiType local_80;
  ContextType local_7c;
  ApiType local_78;
  ContextType local_74;
  ApiType local_70;
  ContextType local_6c;
  ApiType local_68 [4];
  ContextType local_58;
  DefaultDeleter<glu::ContextInfo> local_51;
  undefined1 local_50 [8];
  UniquePtr<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_> info;
  Functions *gl;
  void *data_local;
  size_t size_local;
  size_t offset_local;
  size_t bufferSize_local;
  deUint32 internalFormat_local;
  TextureBuffer *this_local;
  
  info.super_UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>.m_data._8_4_ =
       (*this->m_context->_vptr_RenderContext[3])();
  info.super_UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>.m_data._12_4_ =
       extraout_var;
  pCVar4 = ContextInfo::create(this->m_context);
  de::DefaultDeleter<glu::ContextInfo>::DefaultDeleter(&local_51);
  de::details::UniquePtr<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>::UniquePtr
            ((UniquePtr<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_> *)local_50,pCVar4);
  if ((in_RCX != 0) || (in_R8 != 0)) {
    local_58.super_ApiType.m_bits = (ApiType)(*this->m_context->_vptr_RenderContext[2])();
    ApiType::ApiType(local_68,3,3,PROFILE_CORE);
    bVar2 = contextSupports(local_58,local_68[0]);
    if (bVar2) {
      pCVar4 = de::details::UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>::
               operator->((UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_> *)
                          local_50);
      bVar2 = ContextInfo::isExtensionSupported(pCVar4,"GL_ARB_texture_buffer_range");
      if (bVar2) goto LAB_00d3b562;
    }
    local_6c.super_ApiType.m_bits = (ApiType)(*this->m_context->_vptr_RenderContext[2])();
    ApiType::ApiType(&local_70,3,1,PROFILE_ES);
    bVar2 = contextSupports(local_6c,local_70);
    if (bVar2) {
      pCVar4 = de::details::UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>::
               operator->((UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_> *)
                          local_50);
      bVar2 = ContextInfo::isExtensionSupported(pCVar4,"GL_EXT_texture_buffer");
      if (bVar2) goto LAB_00d3b562;
    }
    pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar5,"Ranged texture buffers not supported","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
               ,0x35f);
    __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
    ;
  }
  local_74.super_ApiType.m_bits = (ApiType)(*this->m_context->_vptr_RenderContext[2])();
  ApiType::ApiType(&local_78,3,3,PROFILE_CORE);
  bVar2 = contextSupports(local_74,local_78);
  if (bVar2) {
LAB_00d3b562:
    de::ArrayBuffer<unsigned_char,_1UL,_1UL>::setStorage(&this->m_refBuffer,in_RDX);
    if (in_R9 != (void *)0x0) {
      dst = de::ArrayBuffer<unsigned_char,_1UL,_1UL>::getPtr(&this->m_refBuffer);
      offset_local._0_4_ = (int)in_RDX;
      ::deMemcpy(dst,in_R9,(long)(int)offset_local);
    }
    this->m_format = (deUint32)ctx;
    this->m_offset = in_RCX;
    this->m_size = in_R8;
    (**(code **)(info.super_UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>.
                 m_data._8_8_ + 0x6f8))(1,&this->m_glTexture);
    dVar3 = (**(code **)(info.
                         super_UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>.
                         m_data._8_8_ + 0x800))();
    checkError(dVar3,"glGenTextures() failed",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
               ,0x378);
    (**(code **)(info.super_UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>.
                 m_data._8_8_ + 0x6c8))(1,&this->m_glBuffer);
    dVar3 = (**(code **)(info.
                         super_UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>.
                         m_data._8_8_ + 0x800))();
    checkError(dVar3,"glGenBuffers() failed",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
               ,0x37b);
    (**(code **)(info.super_UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>.
                 m_data._8_8_ + 0x40))(0x8c2a,this->m_glBuffer);
    pcVar1 = *(code **)(info.
                        super_UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>.
                        m_data._8_8_ + 0x150);
    sVar6 = de::ArrayBuffer<unsigned_char,_1UL,_1UL>::size(&this->m_refBuffer);
    (*pcVar1)(0x8c2a,(long)(int)sVar6,in_R9,0x88e4);
    (**(code **)(info.super_UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>.
                 m_data._8_8_ + 0x40))(0x8c2a,0);
    dVar3 = (**(code **)(info.
                         super_UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>.
                         m_data._8_8_ + 0x800))();
    checkError(dVar3,"Failed to create buffer",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
               ,0x380);
    (**(code **)(info.super_UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>.
                 m_data._8_8_ + 0xb8))(0x8c2a,this->m_glTexture);
    if ((in_RCX == 0) && (in_R8 == 0)) {
      (**(code **)(info.super_UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>.
                   m_data._8_8_ + 0x12f8))(0x8c2a,this->m_format,this->m_glBuffer);
    }
    else {
      (**(code **)(info.super_UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>.
                   m_data._8_8_ + 0x1300))
                (0x8c2a,this->m_format,this->m_glBuffer,this->m_offset,this->m_size);
    }
    (**(code **)(info.super_UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>.
                 m_data._8_8_ + 0xb8))(0x8c2a,0);
    dVar3 = (**(code **)(info.
                         super_UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>.
                         m_data._8_8_ + 0x800))();
    checkError(dVar3,"Failed to bind buffer to texture",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
               ,0x38a);
    de::details::UniquePtr<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>::~UniquePtr
              ((UniquePtr<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_> *)local_50);
    return extraout_EAX;
  }
  local_7c.super_ApiType.m_bits = (ApiType)(*this->m_context->_vptr_RenderContext[2])();
  ApiType::ApiType(&local_80,3,1,PROFILE_ES);
  bVar2 = contextSupports(local_7c,local_80);
  if (bVar2) {
    pCVar4 = de::details::UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>::
             operator->((UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_> *)
                        local_50);
    bVar2 = ContextInfo::isExtensionSupported(pCVar4,"GL_EXT_texture_buffer");
    if (bVar2) goto LAB_00d3b562;
  }
  pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (pNVar5,"Texture buffers not supported","",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
             ,0x368);
  __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

void TextureBuffer::init (deUint32 internalFormat, size_t bufferSize, size_t offset, size_t size, const void* data)
{
	const glw::Functions&		gl		= m_context.getFunctions();
	de::UniquePtr<ContextInfo>	info	(ContextInfo::create(m_context));

	if (offset != 0 || size != 0)
	{
		if (!(contextSupports(m_context.getType(), glu::ApiType(3, 3, glu::PROFILE_CORE)) && info->isExtensionSupported("GL_ARB_texture_buffer_range"))
			&& !(contextSupports(m_context.getType(), glu::ApiType(3, 1, glu::PROFILE_ES))
				&& info->isExtensionSupported("GL_EXT_texture_buffer")))
		{
			throw tcu::NotSupportedError("Ranged texture buffers not supported", "", __FILE__, __LINE__);
		}
	}
	else
	{
		if (!contextSupports(m_context.getType(), glu::ApiType(3, 3, glu::PROFILE_CORE))
			&& !(contextSupports(m_context.getType(), glu::ApiType(3, 1, glu::PROFILE_ES))
				&& info->isExtensionSupported("GL_EXT_texture_buffer")))
		{
			throw tcu::NotSupportedError("Texture buffers not supported", "", __FILE__, __LINE__);
		}
	}

	m_refBuffer.setStorage(bufferSize);
	if (data)
		deMemcpy(m_refBuffer.getPtr(), data, (int)bufferSize);

	m_format	= internalFormat;
	m_offset	= offset;
	m_size		= size;

	DE_ASSERT(size != 0 || offset == 0);

	{
		gl.genTextures(1, &m_glTexture);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures() failed");

		gl.genBuffers(1, &m_glBuffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers() failed");

		gl.bindBuffer(GL_TEXTURE_BUFFER, m_glBuffer);
		gl.bufferData(GL_TEXTURE_BUFFER, (glw::GLsizei)m_refBuffer.size(), data, GL_STATIC_DRAW);
		gl.bindBuffer(GL_TEXTURE_BUFFER, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to create buffer");

		gl.bindTexture(GL_TEXTURE_BUFFER, m_glTexture);

		if (offset != 0 || size != 0)
			gl.texBufferRange(GL_TEXTURE_BUFFER, m_format, m_glBuffer, (glw::GLintptr)m_offset, (glw::GLsizeiptr)m_size);
		else
			gl.texBuffer(GL_TEXTURE_BUFFER, m_format, m_glBuffer);

		gl.bindTexture(GL_TEXTURE_BUFFER, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to bind buffer to texture");
	}
}